

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_opp(uint64_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar3 = (ulong)(*arg1 != 0) + arg1[1];
  uVar4 = -lVar3;
  uVar6 = (ulong)(byte)-(-(lVar3 != 0) - CARRY8((ulong)(*arg1 != 0),arg1[1]));
  lVar3 = uVar6 + arg1[2];
  uVar7 = -lVar3;
  uVar6 = (ulong)(byte)-(-(lVar3 != 0) - CARRY8(uVar6,arg1[2]));
  lVar3 = uVar6 + arg1[3];
  uVar2 = -(ulong)((bool)-(lVar3 != 0) != CARRY8(uVar6,arg1[3]));
  uVar5 = (ulong)((uint)uVar2 & 0xc99);
  uVar6 = (ulong)CARRY8(uVar5,-*arg1);
  uVar1 = (ulong)CARRY8(uVar4,uVar6);
  *out1 = uVar5 + -*arg1;
  out1[1] = uVar4 + uVar6;
  out1[2] = uVar7 + uVar1;
  out1[3] = ((uVar2 & 0x8000000000000000) - lVar3) + (ulong)CARRY8(uVar7,uVar1);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(
    uint64_t *out1, fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 *out2,
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 arg1, uint64_t arg2,
    uint64_t arg3) {
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_int128 x1;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_int1 x2;
    uint64_t x3;
    x1 = ((arg2 - (fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_int128)arg1) -
          arg3);
    x2 = (fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_int1)(x1 >> 64);
    x3 = (uint64_t)(x1 & UINT64_C(0xffffffffffffffff));
    *out1 = x3;
    *out2 = (fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1)(0x0 - x2);
}